

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeMsg.cpp
# Opt level: O2

int32_t MsgHelper::serializeAddr(S5AddrInfo *info,uint8_t *buf)

{
  char *__cp;
  uint8_t uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  
  uVar1 = info->ATYP;
  __cp = info->ADDR;
  *buf = uVar1;
  if (uVar1 == '\x04') {
    iVar2 = inet_pton(10,__cp,buf + 1);
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 0x11;
  }
  else if (uVar1 == '\x01') {
    iVar2 = inet_pton(2,__cp,buf + 1);
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 5;
  }
  else {
    sVar3 = strlen(__cp);
    buf[1] = (uint8_t)sVar3;
    memcpy(buf + 2,__cp,sVar3 & 0xff);
    uVar4 = ((uint)sVar3 & 0xff) + 2;
  }
  writeUint16InBigEndian(buf + uVar4,info->PORT);
  return uVar4 + 2;
}

Assistant:

int32_t MsgHelper::serializeAddr(const S5AddrInfo* info, uint8_t* buf)
{
	int32_t ADDR_LEN;
	buf[0] = info->ATYP;
	if(info->ATYP == SOKS5_ATYP_IPV4)
	{
		ADDR_LEN = 4;
		if(0 == ::inet_pton(AF_INET, info->ADDR, &buf[1]))
			return 0;
	}
	else if(info->ATYP == SOKS5_ATYP_IPV6)
	{
		ADDR_LEN = 16;
		if(0 == ::inet_pton(AF_INET6, info->ADDR, &buf[1]))
			return 0;
	}
	else
	{
		buf[1] = (uint8_t)strlen(info->ADDR);
		memcpy(buf + 2, info->ADDR, buf[1]);
		ADDR_LEN = buf[1] + 1;
	}
	writeUint16InBigEndian((void*)&buf[1 + ADDR_LEN], info->PORT);
	return 1 + ADDR_LEN + 2;
}